

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ArrayOrRandomizeMethodExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ArrayOrRandomizeMethodExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ParenExpressionListSyntax*&,slang::syntax::ConstraintBlockSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,
          ParenExpressionListSyntax **args_2,ConstraintBlockSyntax **args_3)

{
  ParenExpressionListSyntax *pPVar1;
  ConstraintBlockSyntax *pCVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  ArrayOrRandomizeMethodExpressionSyntax *pAVar8;
  
  pAVar8 = (ArrayOrRandomizeMethodExpressionSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ArrayOrRandomizeMethodExpressionSyntax *)this->endPtr < pAVar8 + 1) {
    pAVar8 = (ArrayOrRandomizeMethodExpressionSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pAVar8 + 1);
  }
  TVar4 = args_1->kind;
  uVar5 = args_1->field_0x2;
  NVar6.raw = (args_1->numFlags).raw;
  uVar7 = args_1->rawLen;
  pIVar3 = args_1->info;
  pPVar1 = *args_2;
  pCVar2 = *args_3;
  (pAVar8->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pAVar8->super_ExpressionSyntax).super_SyntaxNode.kind = ArrayOrRandomizeMethodExpression;
  (pAVar8->method).ptr = args;
  (pAVar8->with).kind = TVar4;
  (pAVar8->with).field_0x2 = uVar5;
  (pAVar8->with).numFlags = (NumericTokenFlags)NVar6.raw;
  (pAVar8->with).rawLen = uVar7;
  (pAVar8->with).info = pIVar3;
  pAVar8->args = pPVar1;
  pAVar8->constraints = pCVar2;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pAVar8;
  if (pPVar1 != (ParenExpressionListSyntax *)0x0) {
    (pPVar1->super_SyntaxNode).parent = (SyntaxNode *)pAVar8;
  }
  if (pCVar2 != (ConstraintBlockSyntax *)0x0) {
    (pCVar2->super_ConstraintItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)pAVar8;
  }
  return pAVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }